

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderTessellationgl_TessCoord::initTest
          (TessellationShaderTessellationgl_TessCoord *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  GLuint GVar4;
  NotSupportedError *pNVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  TestError *this_00;
  undefined1 local_124 [8];
  _test_descriptor test;
  _tessellation_levels *levels;
  __normal_iterator<glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
  local_d8;
  __normal_iterator<const_glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
  local_d0;
  _tessellation_levels_set_const_iterator levels_iterator;
  _tessellation_levels_set tessellation_levels;
  int primitive_mode;
  GLint gl_max_tess_gen_level_value;
  GLint compile_status;
  GLuint shader;
  uint n_shader;
  uint n_shaders;
  GLuint shaders [2];
  char *vs_body;
  char *fs_body;
  Functions *gl;
  string local_70;
  ApiType local_4c;
  undefined1 local_45;
  allocator<char> local_31;
  string local_30;
  TessellationShaderTessellationgl_TessCoord *local_10;
  TessellationShaderTessellationgl_TessCoord *this_local;
  
  local_10 = this;
  if (((this->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) == 0) {
    local_45 = 1;
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Tessellation shader functionality not supported, skipping",
               &local_31);
    tcu::NotSupportedError::NotSupportedError(pNVar5,&local_30);
    local_45 = 0;
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  local_4c.m_bits = (*pRVar6->_vptr_RenderContext[2])();
  bVar1 = glu::isContextTypeES((ContextType)local_4c.m_bits);
  if ((bVar1) && (this->m_test_type == TESSELLATION_TEST_TYPE_TES)) {
    gl._6_1_ = 1;
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Test can\'t be run in ES context",
               (allocator<char> *)((long)&gl + 7));
    tcu::NotSupportedError::NotSupportedError(pNVar5,&local_70);
    gl._6_1_ = 0;
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar6->_vptr_RenderContext[3])();
  fs_body = (char *)CONCAT44(extraout_var,iVar2);
  (**(code **)(fs_body + 0x708))(1,&this->m_vao_id);
  dVar3 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar3,"Could not generate vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x6db);
  (**(code **)(fs_body + 0xd8))(this->m_vao_id);
  dVar3 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar3,"Error binding vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x6de);
  (**(code **)(fs_body + 0x6c8))(1,&this->m_bo_id);
  dVar3 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar3,"glGenBuffers() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x6e1);
  GVar4 = (**(code **)(fs_body + 0x3f0))
                    ((this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER);
  this->m_broken_ts_id = GVar4;
  GVar4 = (**(code **)(fs_body + 0x3f0))(0x8b30);
  this->m_fs_id = GVar4;
  GVar4 = (**(code **)(fs_body + 0x3f0))(0x8b31);
  this->m_vs_id = GVar4;
  dVar3 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar3,"glCreateShader() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x6e6);
  vs_body = "${VERSION}\n\nvoid main()\n{\n}\n";
  TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,this->m_fs_id,1,&vs_body);
  dVar3 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar3,"glShaderSource() failed for fragment shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x6f0);
  shaders = (GLuint  [2])anon_var_dwarf_63ec42;
  TestCaseBase::shaderSourceSpecialized
            (&this->super_TestCaseBase,this->m_vs_id,1,(GLchar **)shaders);
  dVar3 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar3,"glShaderSource() failed for vertex shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x6fb);
  n_shader = this->m_fs_id;
  n_shaders = this->m_vs_id;
  shader = 2;
  compile_status = 0;
  do {
    if (1 < (uint)compile_status) {
      tessellation_levels.
      super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      (**(code **)(fs_body + 0x868))
                ((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_GEN_LEVEL,
                 (undefined1 *)
                 ((long)&tessellation_levels.
                         super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      dVar3 = (**(code **)(fs_body + 0x800))();
      glu::checkError(dVar3,"glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x71a);
      for (tessellation_levels.
           super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                TESSELLATION_SHADER_PRIMITIVE_MODE_FIRST;
          (_tessellation_primitive_mode)
          tessellation_levels.
          super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage !=
          TESSELLATION_SHADER_PRIMITIVE_MODE_COUNT;
          tessellation_levels.
          super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
               (_tessellation_primitive_mode)
               tessellation_levels.
               super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage +
               TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES) {
        TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode
                  ((_tessellation_levels_set *)&levels_iterator,
                   (_tessellation_primitive_mode)
                   tessellation_levels.
                   super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   tessellation_levels.
                   super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                   TESSELLATION_LEVEL_SET_FILTER_ALL_LEVELS_USE_THE_SAME_VALUE);
        local_d8._M_current =
             (_tessellation_levels *)
             std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
             ::begin((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                      *)&levels_iterator);
        __gnu_cxx::
        __normal_iterator<glcts::_tessellation_levels_const*,std::vector<glcts::_tessellation_levels,std::allocator<glcts::_tessellation_levels>>>
        ::__normal_iterator<glcts::_tessellation_levels*>
                  ((__normal_iterator<glcts::_tessellation_levels_const*,std::vector<glcts::_tessellation_levels,std::allocator<glcts::_tessellation_levels>>>
                    *)&local_d0,&local_d8);
        while( true ) {
          levels = (_tessellation_levels *)
                   std::
                   vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                   ::end((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                          *)&levels_iterator);
          bVar1 = __gnu_cxx::operator!=
                            (&local_d0,
                             (__normal_iterator<glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
                              *)&levels);
          if (!bVar1) break;
          test._52_8_ = __gnu_cxx::
                        __normal_iterator<const_glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
                        ::operator*(&local_d0);
          _test_descriptor::_test_descriptor((_test_descriptor *)local_124);
          initTestDescriptor(this,(_test_descriptor *)local_124,
                             TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,
                             (_tessellation_primitive_mode)
                             tessellation_levels.
                             super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,1,
                             (float *)test._52_8_,(float *)(test._52_8_ + 8),this->m_test_type);
          std::
          vector<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor,_std::allocator<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor>_>
          ::push_back(&this->m_tests,(value_type *)local_124);
          __gnu_cxx::
          __normal_iterator<const_glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
          ::operator++(&local_d0,0);
        }
        std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::
        ~vector((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_> *
                )&levels_iterator);
      }
      (**(code **)(fs_body + 0x40))(0x8c8e,this->m_bo_id);
      dVar3 = (**(code **)(fs_body + 0x800))();
      glu::checkError(dVar3,"glBindBuffer() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x738);
      (**(code **)(fs_body + 0x48))(0x8c8e,0,this->m_bo_id);
      dVar3 = (**(code **)(fs_body + 0x800))();
      glu::checkError(dVar3,"glBindBufferBase() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x73b);
      return;
    }
    gl_max_tess_gen_level_value = (&n_shader)[(uint)compile_status];
    if (gl_max_tess_gen_level_value != 0) {
      primitive_mode = 0;
      (**(code **)(fs_body + 0x248))(gl_max_tess_gen_level_value);
      dVar3 = (**(code **)(fs_body + 0x800))();
      glu::checkError(dVar3,"glCompileShader() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x70a);
      (**(code **)(fs_body + 0xa70))(gl_max_tess_gen_level_value,0x8b81,&primitive_mode);
      dVar3 = (**(code **)(fs_body + 0x800))();
      glu::checkError(dVar3,"glGetShaderiv() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x70d);
      if (primitive_mode != 1) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Shader compilation failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                   ,0x711);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
    }
    compile_status = compile_status + 1;
  } while( true );
}

Assistant:

void TessellationShaderTessellationgl_TessCoord::initTest()
{
	/* Skip if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	if (glu::isContextTypeES(m_context.getRenderContext().getType()) && m_test_type == TESSELLATION_TEST_TYPE_TES)
	{
		throw tcu::NotSupportedError("Test can't be run in ES context");
	}

	/* Generate all test-wide objects needed for test execution */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	gl.genBuffers(1, &m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() failed");

	m_broken_ts_id = gl.createShader(m_glExtTokens.TESS_EVALUATION_SHADER);
	m_fs_id		   = gl.createShader(GL_FRAGMENT_SHADER);
	m_vs_id		   = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() failed");

	/* Configure fragment shader body */
	const char* fs_body = "${VERSION}\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "}\n";

	shaderSourceSpecialized(m_fs_id, 1 /* count */, &fs_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for fragment shader");

	/* Configure vertex shader body */
	const char* vs_body = "${VERSION}\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    gl_Position = vec4(1.0, 0.0, 0.0, 1.0);\n"
						  "}\n";

	shaderSourceSpecialized(m_vs_id, 1 /* count */, &vs_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for vertex shader");

	/* Compile all the shaders */
	const glw::GLuint  shaders[] = { m_fs_id, m_vs_id };
	const unsigned int n_shaders = sizeof(shaders) / sizeof(shaders[0]);

	for (unsigned int n_shader = 0; n_shader < n_shaders; ++n_shader)
	{
		glw::GLuint shader = shaders[n_shader];

		if (shader != 0)
		{
			glw::GLint compile_status = GL_FALSE;

			gl.compileShader(shader);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() failed");

			gl.getShaderiv(shader, GL_COMPILE_STATUS, &compile_status);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() failed");

			if (compile_status != GL_TRUE)
			{
				TCU_FAIL("Shader compilation failed");
			}
		}
	} /* for (all shaders) */

	/* Retrieve GL_MAX_TESS_GEN_LEVEL_EXT value before we start looping */
	glw::GLint gl_max_tess_gen_level_value = 0;

	gl.getIntegerv(m_glExtTokens.MAX_TESS_GEN_LEVEL, &gl_max_tess_gen_level_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname");

	/* Initialize all test passes - iterate over all primitive modes supported.. */
	for (int primitive_mode = static_cast<int>(TESSELLATION_SHADER_PRIMITIVE_MODE_FIRST);
		 primitive_mode != static_cast<int>(TESSELLATION_SHADER_PRIMITIVE_MODE_COUNT); primitive_mode++)
	{
		/* Iterate over all tessellation level combinations defined for current primitive mode */
		_tessellation_levels_set tessellation_levels = TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode(
			static_cast<_tessellation_primitive_mode>(primitive_mode), gl_max_tess_gen_level_value,
			TESSELLATION_LEVEL_SET_FILTER_ALL_LEVELS_USE_THE_SAME_VALUE);

		for (_tessellation_levels_set_const_iterator levels_iterator = tessellation_levels.begin();
			 levels_iterator != tessellation_levels.end(); levels_iterator++)
		{
			const _tessellation_levels& levels = *levels_iterator;
			_test_descriptor			test;

			initTestDescriptor(test, TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,
							   static_cast<_tessellation_primitive_mode>(primitive_mode), 1, /* n_patch_vertices */
							   levels.inner, levels.outer, m_test_type);

			/* Store the test descriptor */
			m_tests.push_back(test);
		} /* for (all tessellation level combinations for current primitive mode) */
	}	 /* for (all primitive modes) */

	/* Set up buffer object bindings. Storage size will be determined on
	 * a per-iteration basis.
	 **/
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() failed");
}